

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O1

DataBuffer * __thiscall MIDI::Track::data(DataBuffer *__return_storage_ptr__,Track *this)

{
  ChannelEvent *this_00;
  byte bVar1;
  byte bVar2;
  int iVar3;
  _func_int **pp_Var4;
  size_t in_RCX;
  void *__buf;
  ulong uVar5;
  DataBuffer eventData;
  byte *local_80 [2];
  uint local_70;
  DataBuffer local_68;
  DataBuffer local_48;
  
  DataBuffer::DataBuffer(__return_storage_ptr__,1000000);
  if ((this->_events).super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->_events).super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar5 = 0;
    bVar2 = '\0';
    do {
      DataBuffer::DataBuffer(&local_68);
      iVar3 = (**(this->_events).super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar5]->_vptr_Event)();
      if (iVar3 == 1) {
        this_00 = (ChannelEvent *)
                  (this->_events).super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar5];
        bVar1 = ChannelEvent::command(this_00);
        if (bVar1 != bVar2) {
          pp_Var4 = (this_00->super_Event)._vptr_Event;
        }
        else {
          pp_Var4 = (this_00->super_Event)._vptr_Event;
        }
        (*pp_Var4[3])(local_80,this_00,(ulong)(bVar1 == bVar2));
        local_68._pos = local_70;
        local_68._data = local_80[0];
        local_68._8_8_ = local_80[1];
        bVar2 = ChannelEvent::command(this_00);
      }
      else {
        (*(this->_events).super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5]->_vptr_Event[1])(local_80);
        local_68._pos = local_70;
        local_68._data = local_80[0];
        local_68._8_8_ = local_80[1];
      }
      DataBuffer::DataBuffer(&local_48,&local_68);
      DataBuffer::write(__return_storage_ptr__,(int)&local_48,__buf,in_RCX);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(this->_events).
                                   super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->_events).
                                   super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

DataBuffer Track::data()
  {
    DataBuffer data(1000000);
    
    byte lastCommand=MIDI_CHEVENT_INVALID;
    
    for(int i=0;i<_events.size();i++)
      {
	DataBuffer eventData;
	if(_events[i]->type()==MIDI_CHEVENT)
	  {
	    ChannelEvent *chevent=(ChannelEvent*)_events[i];
	    if(chevent->command()==lastCommand)
	      eventData=chevent->data(true);
	    else
	      eventData=chevent->data(false);
	    
	    lastCommand=chevent->command();
	  }
	else
	  eventData=_events[i]->data();
	
	data.write(eventData);
      }
    
    return data;
  }